

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void init_proc_604(CPUPPCState_conflict2 *env)

{
  PowerPCCPU_conflict3 *cpu;
  CPUPPCState_conflict2 *env_local;
  
  gen_spr_ne_601(env);
  gen_spr_sdr1(env);
  gen_spr_604(env);
  gen_tbl(env);
  _spr_register(env,0x3f0,"HID0",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  gen_low_BATs(env);
  init_excp_604(env);
  env->dcache_line_size = 0x20;
  env->icache_line_size = 0x20;
  cpu = (PowerPCCPU_conflict3 *)env_archcpu((CPUArchState_conflict22 *)env);
  ppc6xx_irq_init_ppc64(cpu);
  return;
}

Assistant:

static void init_proc_604(CPUPPCState *env)
{
    gen_spr_ne_601(env);
    gen_spr_sdr1(env);
    gen_spr_604(env);
    /* Time base */
    gen_tbl(env);
    /* Hardware implementation registers */
    /* XXX : not implemented */
    spr_register(env, SPR_HID0, "HID0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Memory management */
    gen_low_BATs(env);
    init_excp_604(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    /* Allocate hardware IRQ controller */
    ppc6xx_irq_init(env_archcpu(env));
}